

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O0

FundPsbtResponseStruct *
cfd::js::api::PsbtStructApi::FundPsbt
          (FundPsbtResponseStruct *__return_storage_ptr__,FundPsbtRequestStruct *request)

{
  FundPsbtRequestStruct *this;
  string *in_R8;
  allocator local_169;
  function<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&)>
  local_168;
  undefined1 local_148 [302];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  FundPsbtRequestStruct *pFStack_18;
  anon_class_1_0_00000001 call_func;
  FundPsbtRequestStruct *request_local;
  FundPsbtResponseStruct *result;
  
  local_1a = 0;
  pFStack_18 = request;
  FundPsbtResponseStruct::FundPsbtResponseStruct(__return_storage_ptr__);
  this = pFStack_18;
  std::function<cfd::js::api::FundPsbtResponseStruct(cfd::js::api::FundPsbtRequestStruct_const&)>::
  function<cfd::js::api::PsbtStructApi::FundPsbt(cfd::js::api::FundPsbtRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::FundPsbtResponseStruct(cfd::js::api::FundPsbtRequestStruct_const&)>
              *)local_148,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"FundPsbt",&local_169);
  ExecuteStructApi<cfd::js::api::FundPsbtRequestStruct,cfd::js::api::FundPsbtResponseStruct>
            ((FundPsbtResponseStruct *)(local_148 + 0x20),(api *)this,
             (FundPsbtRequestStruct *)local_148,&local_168,in_R8);
  FundPsbtResponseStruct::operator=
            (__return_storage_ptr__,(FundPsbtResponseStruct *)(local_148 + 0x20));
  FundPsbtResponseStruct::~FundPsbtResponseStruct((FundPsbtResponseStruct *)(local_148 + 0x20));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::function<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&)>
  ::~function((function<cfd::js::api::FundPsbtResponseStruct_(const_cfd::js::api::FundPsbtRequestStruct_&)>
               *)local_148);
  return __return_storage_ptr__;
}

Assistant:

FundPsbtResponseStruct PsbtStructApi::FundPsbt(
    const FundPsbtRequestStruct& request) {
  auto call_func = [](const FundPsbtRequestStruct& request)
      -> FundPsbtResponseStruct {  // NOLINT
    Psbt psbt;
    GetPsbtFromString(request.psbt, "FundPsbt", &psbt);

    std::vector<UtxoData> utxos;
    for (auto& utxo : request.utxos) {
      UtxoData data = {};
      data.address_type = AddressType::kP2shAddress;
      data.block_height = 0;
      data.binary_data = nullptr;

      data.txid = Txid(utxo.txid);
      data.vout = utxo.vout;
      data.amount = Amount::CreateBySatoshiAmount(utxo.amount);
      data.descriptor = utxo.descriptor;
      auto desc = Descriptor::Parse(data.descriptor);
      if (!utxo.script_sig_template.empty()) {
        data.scriptsig_template = Script(utxo.script_sig_template);
      }
      utxos.push_back(data);
    }

    const FundFeeInformationStruct& fee_info = request.fee_info;
    CoinSelectionOption option;
    option.InitializeTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_info.fee_rate);
    option.SetLongTermFeeBaserate(fee_info.long_term_fee_rate);
    option.SetKnapsackMinimumChange(fee_info.knapsack_min_change);
    option.SetDustFeeRate(fee_info.dust_fee_rate);

    auto change_address = Descriptor::Parse(request.reserved_descriptor);
    NetType net_type = AddressStructApi::ConvertNetType(request.network);
    Amount fee;
    uint32_t past_txout_count = psbt.GetTxOutCount();

    psbt.FundTransaction(
        utxos, fee_info.fee_rate, &change_address, &fee, &option);

    FundPsbtResponseStruct response;
    response.psbt = psbt.GetBase64();
    response.hex = psbt.GetData().GetHex();
    response.fee_amount = fee.GetSatoshiValue();
    if (past_txout_count != psbt.GetTxOutCount()) {
      auto ref = change_address.GetReference();
      if (ref.HasAddress()) {
        auto addr = ref.GenerateAddress(net_type);
        response.used_addresses.emplace_back(addr.GetAddress());
      }
    }
    return response;
  };

  FundPsbtResponseStruct result;
  result = ExecuteStructApi<FundPsbtRequestStruct, FundPsbtResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}